

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLSidAddress.cpp
# Opt level: O0

void __thiscall COLLADASaxFWL::SidAddress::SidAddress(SidAddress *this,String *sidAddress)

{
  undefined8 *in_RDI;
  String *in_stack_00000258;
  SidAddress *in_stack_00000260;
  
  *in_RDI = &PTR__SidAddress_00db4670;
  std::__cxx11::string::string((string *)(in_RDI + 1));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x79c093);
  *(undefined4 *)(in_RDI + 8) = 0;
  std::__cxx11::string::string((string *)(in_RDI + 9));
  in_RDI[0xd] = 0;
  in_RDI[0xe] = 0;
  *(undefined1 *)(in_RDI + 0xf) = 0;
  parseAddress(in_stack_00000260,in_stack_00000258);
  return;
}

Assistant:

SidAddress::SidAddress( const String& sidAddress )
		: mMemberSelection(MEMBER_SELECTION_NONE)
		, mFirstIndex(0)
		, mSecondIndex(0)
		, mIsValid(false)
	{
		parseAddress( sidAddress );
	}